

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

int __thiscall HModel::util_chgCostsAll(HModel *this,double *XcolCost)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  
  iVar1 = this->numCol;
  if (0 < (long)iVar1) {
    pdVar2 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      pdVar2[lVar4] = XcolCost[lVar4] * pdVar3[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  mlFg_Update(this,this->mlFg_action_NewCosts);
  return 0;
}

Assistant:

int HModel::util_chgCostsAll(const double* XcolCost) {
  assert(XcolCost != NULL);
  for (int col = 0; col < numCol; ++col) {
    colCost[col] =  XcolCost[col] * colScale[col];
  }
  //Deduce the consequences of new costs
  mlFg_Update(mlFg_action_NewCosts);
  return 0;
}